

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,longlong *v,longlong v_min,
               longlong v_max,char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  longlong lVar5;
  long *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  long in_R8;
  long in_R9;
  bool bVar6;
  bool bVar7;
  float axis_00;
  float fVar8;
  float rhs;
  float lhs;
  float fVar9;
  float fVar10;
  float fVar11;
  uint in_stack_00000010;
  ImVec2 *in_stack_00000018;
  float grab_pos_1;
  float grab_t_1;
  longlong v_new_1;
  float new_clicked_t;
  longlong v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  bool tweak_fast;
  bool tweak_slow;
  float input_delta;
  bool clicked_around_grab;
  float grab_pos;
  float grab_t;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  longlong v_range;
  bool is_floating_point;
  bool is_logarithmic;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  float local_114;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  char cVar12;
  float in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  long local_f8;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  float local_c4;
  ImRect local_c0;
  longlong local_b0;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  ImGuiDataType data_type_00;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  byte in_stack_ffffffffffffff77;
  float in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  float logarithmic_zero_epsilon_00;
  undefined1 uVar13;
  byte bVar14;
  undefined4 in_stack_ffffffffffffff94;
  int iVar15;
  undefined1 is_logarithmic_00;
  float fVar16;
  float fVar17;
  
  pIVar1 = GImGui;
  is_logarithmic_00 = (undefined1)((uint)in_stack_ffffffffffffff94 >> 0x18);
  data_type_00 = (ImGuiDataType)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  uVar3 = (uint)((in_stack_00000010 & 0x100000) != 0);
  bVar6 = in_EDX == 8;
  bVar7 = in_EDX == 9;
  if (in_R8 < in_R9) {
    local_f8 = in_R9 - in_R8;
  }
  else {
    local_f8 = in_R8 - in_R9;
  }
  axis_00 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar8 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  rhs = (axis_00 - fVar8) - 4.0;
  fVar8 = (pIVar1->Style).GrabMinSize;
  local_114 = in_stack_ffffffffffffff70;
  if ((!bVar6 && !bVar7) && (-1 < local_f8)) {
    fVar8 = ImMax<float>(rhs / (float)(local_f8 + 1),(pIVar1->Style).GrabMinSize);
    local_114 = in_stack_ffffffffffffff70;
  }
  fVar8 = ImMin<float>(fVar8,rhs);
  lhs = rhs - fVar8;
  fVar9 = ImVec2::operator[](in_RDI,(long)(int)uVar3);
  fVar9 = fVar8 * 0.5 + fVar9 + 2.0;
  fVar10 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar3);
  fVar10 = -fVar8 * 0.5 + (fVar10 - 2.0);
  fVar17 = 0.0;
  fVar16 = 0.0;
  if ((in_stack_00000010 & 0x20) != 0) {
    if (bVar6 || bVar7) {
      in_stack_ffffffffffffff00 =
           ImParseFormatPrecision
                     ((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                      (int)in_stack_fffffffffffffef4);
    }
    else {
      in_stack_ffffffffffffff00 = 1;
    }
    iVar15 = in_stack_ffffffffffffff00;
    fVar17 = ImPow(0.0,7.475395e-39);
    is_logarithmic_00 = (undefined1)((uint)iVar15 >> 0x18);
    in_stack_fffffffffffffefc = (pIVar1->Style).LogSliderDeadzone * 0.5;
    fVar16 = ImMax<float>(lhs,1.0);
    fVar16 = in_stack_fffffffffffffefc / fVar16;
  }
  logarithmic_zero_epsilon_00 = (float)(in_stack_ffffffffffffff90 & 0xffffff);
  if (pIVar1->ActiveId == in_ESI) {
    logarithmic_zero_epsilon_00 = (float)(in_stack_ffffffffffffff90 & 0xffff);
    in_stack_ffffffffffffff8c = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar4 = ImVec2::operator[](&(pIVar1->IO).MousePos,(long)(int)uVar3);
        in_stack_ffffffffffffff88 = *pfVar4;
        fVar11 = in_stack_fffffffffffffef8;
        if ((pIVar1->ActiveIdIsJustActivated & 1U) != 0) {
          in_stack_ffffffffffffff84 =
               ScaleRatioFromValueT<long_long,long_long,double>
                         ((ImGuiDataType)logarithmic_zero_epsilon_00,
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (bool)in_stack_ffffffffffffff77,local_114,in_stack_ffffffffffffff6c);
          if (uVar3 == 1) {
            in_stack_ffffffffffffff84 = 1.0 - in_stack_ffffffffffffff84;
          }
          in_stack_ffffffffffffff80 = ImLerp<float>(fVar9,fVar10,in_stack_ffffffffffffff84);
          fVar11 = (float)((uint)in_stack_fffffffffffffef8 & 0xffffff);
          if ((-fVar8 * 0.5 + in_stack_ffffffffffffff80) - 1.0 <= in_stack_ffffffffffffff88) {
            fVar11 = (float)CONCAT13(in_stack_ffffffffffffff88 <=
                                     fVar8 * 0.5 + in_stack_ffffffffffffff80 + 1.0,
                                     SUB43(in_stack_fffffffffffffef8,0));
          }
          cVar12 = (char)((uint)fVar11 >> 0x18);
          in_stack_ffffffffffffff7c = CONCAT13(cVar12,(int3)in_stack_ffffffffffffff7c);
          if ((cVar12 == '\0') || (!bVar6 && !bVar7)) {
            in_stack_fffffffffffffef4 = 0.0;
          }
          else {
            in_stack_fffffffffffffef4 = in_stack_ffffffffffffff88 - in_stack_ffffffffffffff80;
          }
          pIVar1->SliderGrabClickOffset = in_stack_fffffffffffffef4;
        }
        if (0.0 < lhs) {
          in_stack_ffffffffffffff8c =
               ImSaturate(((in_stack_ffffffffffffff88 - pIVar1->SliderGrabClickOffset) - fVar9) /
                          lhs);
        }
        if (uVar3 == 1) {
          in_stack_ffffffffffffff8c = 1.0 - in_stack_ffffffffffffff8c;
        }
        logarithmic_zero_epsilon_00 =
             (float)CONCAT13((char)((uint)logarithmic_zero_epsilon_00 >> 0x18),
                             CONCAT12(1,SUB42(logarithmic_zero_epsilon_00,0)));
        in_stack_fffffffffffffef8 = fVar11;
      }
    }
    else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      if ((pIVar1->ActiveIdIsJustActivated & 1U) != 0) {
        pIVar1->SliderCurrentAccum = 0.0;
        pIVar1->SliderCurrentAccumDirty = false;
      }
      if (uVar3 == 0) {
        in_stack_fffffffffffffef0 = GetNavTweakPressedAmount((ImGuiAxis)axis_00);
      }
      else {
        in_stack_fffffffffffffef0 = GetNavTweakPressedAmount((ImGuiAxis)axis_00);
        in_stack_fffffffffffffef0 = -in_stack_fffffffffffffef0;
      }
      if ((in_stack_fffffffffffffef0 != 0.0) ||
         (in_stack_ffffffffffffff78 = in_stack_fffffffffffffef0, NAN(in_stack_fffffffffffffef0))) {
        in_stack_ffffffffffffff78 = in_stack_fffffffffffffef0;
        in_stack_ffffffffffffff77 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
        bVar2 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
        if (bVar6 || bVar7) {
          local_114 = (float)ImParseFormatPrecision
                                       ((char *)CONCAT44(in_stack_fffffffffffffefc,
                                                         in_stack_fffffffffffffef8),
                                        (int)in_stack_fffffffffffffef4);
        }
        else {
          local_114 = 0.0;
        }
        if ((int)local_114 < 1) {
          if (((-100.0 <= (float)local_f8) && ((float)local_f8 <= 100.0)) ||
             ((in_stack_ffffffffffffff77 & 1) != 0)) {
            in_stack_ffffffffffffff78 =
                 (float)(~-(uint)(in_stack_ffffffffffffff78 < 0.0) & 0x3f800000 |
                        -(uint)(in_stack_ffffffffffffff78 < 0.0) & 0xbf800000) / (float)local_f8;
          }
          else {
            in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 / 100.0;
          }
        }
        else {
          in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 / 100.0;
          if ((in_stack_ffffffffffffff77 & 1) != 0) {
            in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 / 10.0;
          }
        }
        if (bVar2) {
          in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 * 10.0;
        }
        pIVar1->SliderCurrentAccum = in_stack_ffffffffffffff78 + pIVar1->SliderCurrentAccum;
        pIVar1->SliderCurrentAccumDirty = true;
      }
      in_stack_ffffffffffffff6c = pIVar1->SliderCurrentAccum;
      if ((pIVar1->NavActivatePressedId == in_ESI) && ((pIVar1->ActiveIdIsJustActivated & 1U) == 0))
      {
        ClearActiveID();
      }
      else if ((pIVar1->SliderCurrentAccumDirty & 1U) != 0) {
        in_stack_ffffffffffffff8c =
             ScaleRatioFromValueT<long_long,long_long,double>
                       ((ImGuiDataType)logarithmic_zero_epsilon_00,
                        CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (bool)in_stack_ffffffffffffff77,local_114,in_stack_ffffffffffffff6c);
        uVar13 = (undefined1)((uint)logarithmic_zero_epsilon_00 >> 0x18);
        if (((1.0 <= in_stack_ffffffffffffff8c) && (0.0 < in_stack_ffffffffffffff6c)) ||
           ((in_stack_ffffffffffffff8c <= 0.0 && (in_stack_ffffffffffffff6c < 0.0)))) {
          logarithmic_zero_epsilon_00 =
               (float)CONCAT13(uVar13,(uint3)SUB42(logarithmic_zero_epsilon_00,0));
          pIVar1->SliderCurrentAccum = 0.0;
        }
        else {
          logarithmic_zero_epsilon_00 =
               (float)CONCAT13(uVar13,CONCAT12(1,SUB42(logarithmic_zero_epsilon_00,0)));
          fVar11 = ImSaturate(in_stack_ffffffffffffff8c + in_stack_ffffffffffffff6c);
          lVar5 = ScaleValueFromRatioT<long_long,long_long,double>
                            ((ImGuiDataType)fVar8,lhs,CONCAT44(fVar9,fVar10),CONCAT44(fVar17,fVar16)
                             ,(bool)is_logarithmic_00,logarithmic_zero_epsilon_00,fVar11);
          data_type_00 = (ImGuiDataType)((ulong)lVar5 >> 0x20);
          in_stack_ffffffffffffff68 = in_stack_ffffffffffffff8c;
          if ((bVar6 || bVar7) && ((in_stack_00000010 & 0x40) == 0)) {
            lVar5 = RoundScalarWithFormatT<long_long>
                              ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff8c)
                               ,data_type_00,
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
            data_type_00 = (ImGuiDataType)((ulong)lVar5 >> 0x20);
            in_stack_ffffffffffffff68 = in_stack_ffffffffffffff8c;
          }
          in_stack_ffffffffffffff8c = fVar11;
          in_stack_ffffffffffffff5c =
               ScaleRatioFromValueT<long_long,long_long,double>
                         ((ImGuiDataType)logarithmic_zero_epsilon_00,
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (bool)in_stack_ffffffffffffff77,local_114,in_stack_ffffffffffffff6c);
          if (in_stack_ffffffffffffff6c <= 0.0) {
            fVar11 = ImMax<float>(in_stack_ffffffffffffff5c - in_stack_ffffffffffffff68,
                                  in_stack_ffffffffffffff6c);
            pIVar1->SliderCurrentAccum = pIVar1->SliderCurrentAccum - fVar11;
          }
          else {
            fVar11 = ImMin<float>(in_stack_ffffffffffffff5c - in_stack_ffffffffffffff68,
                                  in_stack_ffffffffffffff6c);
            pIVar1->SliderCurrentAccum = pIVar1->SliderCurrentAccum - fVar11;
          }
        }
        pIVar1->SliderCurrentAccumDirty = false;
      }
    }
    if (((uint)logarithmic_zero_epsilon_00 & 0x10000) != 0) {
      local_b0 = ScaleValueFromRatioT<long_long,long_long,double>
                           ((ImGuiDataType)fVar8,lhs,CONCAT44(fVar9,fVar10),CONCAT44(fVar17,fVar16),
                            (bool)is_logarithmic_00,logarithmic_zero_epsilon_00,
                            in_stack_ffffffffffffff8c);
      if ((bVar6 || bVar7) && ((in_stack_00000010 & 0x40) == 0)) {
        local_b0 = RoundScalarWithFormatT<long_long>
                             ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              data_type_00,
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      }
      if (*in_RCX != local_b0) {
        *in_RCX = local_b0;
        logarithmic_zero_epsilon_00 = (float)CONCAT13(1,SUB43(logarithmic_zero_epsilon_00,0));
      }
    }
  }
  if (1.0 <= rhs) {
    local_c4 = ScaleRatioFromValueT<long_long,long_long,double>
                         ((ImGuiDataType)logarithmic_zero_epsilon_00,
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (bool)in_stack_ffffffffffffff77,local_114,in_stack_ffffffffffffff6c);
    bVar14 = (byte)((uint)logarithmic_zero_epsilon_00 >> 0x18);
    if (uVar3 == 1) {
      local_c4 = 1.0 - local_c4;
    }
    ImLerp<float>(fVar9,fVar10,local_c4);
    if (uVar3 == 0) {
      ImRect::ImRect((ImRect *)CONCAT44(axis_00,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc
                     ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
      ;
      *in_stack_00000018 = local_d8;
      in_stack_00000018[1] = local_d0;
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(axis_00,in_stack_ffffffffffffff00),in_stack_fffffffffffffefc
                     ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
      ;
      *in_stack_00000018 = local_e8;
      in_stack_00000018[1] = local_e0;
    }
  }
  else {
    ImRect::ImRect(&local_c0,in_RDI,in_RDI);
    bVar14 = (byte)((uint)logarithmic_zero_epsilon_00 >> 0x18);
    *in_stack_00000018 = local_c0.Min;
    in_stack_00000018[1] = local_c0.Max;
  }
  return (bool)(bVar14 & 1);
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);

    // Calculate bounds
    const float grab_padding = 2.0f; // FIXME: Should be part of style.
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    if (!is_floating_point && v_range >= 0)                                     // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize); // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                if (g.ActiveIdIsJustActivated)
                {
                    float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (axis == ImGuiAxis_Y)
                        grab_t = 1.0f - grab_t;
                    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
                    const bool clicked_around_grab = (mouse_abs_pos >= grab_pos - grab_sz * 0.5f - 1.0f) && (mouse_abs_pos <= grab_pos + grab_sz * 0.5f + 1.0f); // No harm being extra generous here.
                    g.SliderGrabClickOffset = (clicked_around_grab && is_floating_point) ? mouse_abs_pos - grab_pos : 0.0f;
                }
                if (slider_usable_sz > 0.0f)
                    clicked_t = ImSaturate((mouse_abs_pos - g.SliderGrabClickOffset - slider_usable_pos_min) / slider_usable_sz);
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            float input_delta = (axis == ImGuiAxis_X) ? GetNavTweakPressedAmount(axis) : -GetNavTweakPressedAmount(axis);
            if (input_delta != 0.0f)
            {
                const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
                const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (tweak_slow)
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || tweak_slow)
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (tweak_fast)
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}